

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_impl.hpp
# Opt level: O0

ostream * toml::operator<<(ostream *os,time_offset *offset)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  char *in_RSI;
  ostream *in_RDI;
  int minute;
  int local_1c;
  
  if ((*in_RSI == '\0') && (in_RSI[1] == '\0')) {
    std::operator<<(in_RDI,'Z');
  }
  else {
    local_1c = *in_RSI * 0x3c + (int)in_RSI[1];
    if (local_1c < 0) {
      std::operator<<(in_RDI,'-');
      if (local_1c < 1) {
        local_1c = -local_1c;
      }
    }
    else {
      std::operator<<(in_RDI,'+');
    }
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(in_RDI,_Var1._M_c);
    _Var2 = CLI::std::setw(2);
    poVar3 = std::operator<<(poVar3,(_Setw)_Var2._M_n);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c / 0x3c);
    std::operator<<(poVar3,':');
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(in_RDI,_Var1._M_c);
    _Var2 = CLI::std::setw(2);
    poVar3 = std::operator<<(poVar3,(_Setw)_Var2._M_n);
    std::ostream::operator<<(poVar3,local_1c % 0x3c);
  }
  return in_RDI;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, const time_offset& offset)
{
    if(offset.hour == 0 && offset.minute == 0)
    {
        os << 'Z';
        return os;
    }
    int minute = static_cast<int>(offset.hour) * 60 + offset.minute;
    if(minute < 0){os << '-'; minute = std::abs(minute);} else {os << '+';}
    os << std::setfill('0') << std::setw(2) << minute / 60 << ':';
    os << std::setfill('0') << std::setw(2) << minute % 60;
    return os;
}